

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcsutil.c
# Opt level: O0

int ffwldp(double xpix,double ypix,double xref,double yref,double xrefpix,double yrefpix,double xinc
          ,double yinc,double rot,char *type,double *xpos,double *ypos,int *status)

{
  bool bVar1;
  char *pcVar2;
  int *in_RCX;
  double *in_RDX;
  double *in_RSI;
  char *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double in_stack_00000008;
  char *cptr;
  double deps;
  double geo3;
  double geo2;
  double geo1;
  double ra0;
  double dec0;
  double sin0;
  double cos0;
  double dd;
  double da;
  double mg;
  double m;
  double l;
  double dt;
  double rat;
  double dect;
  double coss;
  double sins;
  double z;
  double y;
  double x;
  double temp;
  double dz;
  double dy;
  double dx;
  double sinr;
  double cosr;
  double local_128;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_b8;
  double local_88;
  double local_80;
  int local_4;
  
  if (*in_RCX < 1) {
    local_80 = (in_XMM0_Qa - in_XMM4_Qa) * in_XMM6_Qa;
    local_88 = (in_XMM1_Qa - in_XMM5_Qa) * in_XMM7_Qa;
    dVar3 = cos(in_stack_00000008 * 0.01745329252);
    dVar4 = sin(in_stack_00000008 * 0.01745329252);
    if ((in_stack_00000008 != 0.0) || (NAN(in_stack_00000008))) {
      dVar5 = local_88 * dVar4;
      local_88 = local_88 * dVar3 + local_80 * dVar4;
      local_80 = local_80 * dVar3 + -dVar5;
    }
    dVar5 = in_XMM2_Qa * 0.01745329252;
    local_c8 = in_XMM3_Qa * 0.01745329252;
    dVar6 = local_80 * 0.01745329252;
    local_88 = local_88 * 0.01745329252;
    dVar7 = dVar6 * dVar6 + local_88 * local_88;
    dVar8 = cos(local_c8);
    dVar9 = sin(local_c8);
    if (*in_RDI == '-') {
      pcVar2 = in_RDI + 1;
      if (*pcVar2 == 'C') {
        if ((in_RDI[2] != 'A') || (in_RDI[3] != 'R')) {
          *in_RCX = 0x1f8;
          return 0x1f8;
        }
        local_d0 = dVar5 + dVar6;
        local_c8 = local_c8 + local_88;
      }
      else if (*pcVar2 == 'T') {
        if ((in_RDI[2] != 'A') || (in_RDI[3] != 'N')) {
          *in_RCX = 0x1f8;
          return 0x1f8;
        }
        dVar3 = cos(dVar5);
        dVar4 = sin(dVar5);
        dVar7 = cos(dVar5);
        dVar3 = -(local_88 * dVar7) * dVar9 + dVar8 * dVar3 + -(dVar6 * dVar4);
        dVar4 = sin(dVar5);
        dVar7 = cos(dVar5);
        dVar10 = sin(dVar5);
        dVar4 = -(local_88 * dVar10) * dVar9 + dVar8 * dVar4 + dVar6 * dVar7;
        local_d0 = atan2(dVar4,dVar3);
        dVar3 = sqrt(dVar3 * dVar3 + dVar4 * dVar4);
        local_c8 = atan((local_88 * dVar8 + dVar9) / dVar3);
      }
      else if (*pcVar2 == 'S') {
        if ((in_RDI[2] == 'I') && (in_RDI[3] == 'N')) {
          if (1.0 < dVar7) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar3 = sqrt(1.0 - dVar7);
          dVar4 = dVar9 * dVar3 + dVar8 * local_88;
          if ((1.0 < dVar4) || (dVar4 < -1.0)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_c8 = asin(dVar4);
          dVar3 = dVar8 * dVar3 + -(dVar9 * local_88);
          if ((((dVar3 == 0.0) && (!NAN(dVar3))) && (dVar6 == 0.0)) && (!NAN(dVar6))) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_d0 = atan2(dVar6,dVar3);
        }
        else {
          if ((in_RDI[2] != 'T') || (in_RDI[3] != 'G')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          dVar3 = (4.0 - dVar7) / (dVar7 + 4.0);
          if (1.0 < ABS(dVar3)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar4 = dVar3 * dVar9 + (local_88 * dVar8 * (dVar3 + 1.0)) / 2.0;
          if (1.0 < ABS(dVar4)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_c8 = asin(dVar4);
          dVar4 = cos(local_c8);
          if (ABS(dVar4) < 1e-05) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar3 = (dVar6 * (dVar3 + 1.0)) / (dVar4 * 2.0);
          if (1.0 < ABS(dVar3)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_d0 = asin(dVar3);
          dVar3 = sin(local_c8);
          dVar4 = cos(local_c8);
          dVar6 = cos(local_d0);
          dVar3 = dVar4 * dVar8 * dVar6 + dVar3 * dVar9 + 1.0;
          if (ABS(dVar3) < 1e-05) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar4 = sin(local_c8);
          dVar6 = cos(local_c8);
          dVar7 = cos(local_d0);
          if (1e-05 < ABS(((dVar4 * dVar8 + -(dVar6 * dVar9 * dVar7)) * 2.0) / dVar3 - local_88)) {
            local_d0 = 3.141592653589795 - local_d0;
          }
        }
        local_d0 = local_d0 + dVar5;
      }
      else {
        local_d0 = dVar5;
        if (*pcVar2 == 'A') {
          if ((in_RDI[2] == 'R') && (in_RDI[3] == 'C')) {
            if (9.869604401089369 <= dVar7) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            dVar3 = sqrt(dVar7);
            dVar4 = cos(dVar3);
            if ((dVar3 != 0.0) || (NAN(dVar3))) {
              local_b8 = sin(dVar3);
              local_b8 = local_b8 / dVar3;
            }
            else {
              local_b8 = 1.0;
            }
            dVar3 = local_88 * dVar8 * local_b8 + dVar9 * dVar4;
            if ((1.0 < dVar3) || (dVar3 < -1.0)) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            local_c8 = asin(dVar3);
            dVar4 = -dVar3 * dVar9 + dVar4;
            dVar8 = dVar6 * local_b8 * dVar8;
            if ((((dVar4 == 0.0) && (!NAN(dVar4))) && (dVar8 == 0.0)) && (!NAN(dVar8))) {
              *in_RCX = 0x1f5;
              return 0x1f5;
            }
            dVar3 = atan2(dVar8,dVar4);
            local_d0 = dVar5 + dVar3;
          }
          else {
            if ((in_RDI[2] != 'I') || (in_RDI[3] != 'T')) {
              *in_RCX = 0x1f8;
              return 0x1f8;
            }
            local_d8 = in_XMM7_Qa * dVar3 + in_XMM6_Qa * dVar4;
            if ((local_d8 == 0.0) && (!NAN(local_d8))) {
              local_d8 = 1.0;
            }
            local_d8 = local_d8 * 0.01745329252;
            dVar7 = in_XMM3_Qa * 0.01745329252;
            dVar9 = sin(dVar7 + local_d8);
            dVar8 = cos(dVar7 + local_d8);
            dVar8 = sqrt((dVar8 + 1.0) / 2.0);
            dVar10 = sin(dVar7);
            dVar11 = cos(dVar7);
            dVar11 = sqrt((dVar11 + 1.0) / 2.0);
            local_80 = dVar9 / dVar8 - dVar10 / dVar11;
            if ((local_80 == 0.0) && (!NAN(local_80))) {
              local_80 = 1.0;
            }
            dVar9 = local_d8 / local_80;
            local_d8 = in_XMM6_Qa * dVar3 + -(in_XMM7_Qa * dVar4);
            if ((local_d8 == 0.0) && (!NAN(local_d8))) {
              local_d8 = 1.0;
            }
            local_d8 = local_d8 * 0.01745329252;
            dVar3 = cos(dVar7);
            local_80 = sin(local_d8 / 2.0);
            local_80 = dVar3 * 2.0 * local_80;
            if ((local_80 == 0.0) && (!NAN(local_80))) {
              local_80 = 1.0;
            }
            dVar3 = cos(dVar7);
            dVar4 = cos(local_d8 / 2.0);
            dVar3 = sqrt((dVar3 * dVar4 + 1.0) / 2.0);
            local_80 = (local_d8 * dVar3) / local_80;
            dVar3 = sin(dVar7);
            dVar4 = cos(dVar7);
            dVar4 = sqrt((dVar4 + 1.0) / 2.0);
            dVar4 = (dVar9 * dVar3) / dVar4;
            if ((((dVar6 != 0.0) || (NAN(dVar6))) || (local_88 != 0.0)) || (NAN(local_88))) {
              dVar3 = -((local_88 + dVar4) / dVar9) * ((local_88 + dVar4) / dVar9) +
                      (4.0 - (dVar6 * dVar6) / (local_80 * 4.0 * local_80));
              if ((4.0 < dVar3) || (dVar3 < 2.0)) {
                *in_RCX = 0x1f5;
                return 0x1f5;
              }
              dVar3 = sqrt(dVar3);
              dVar9 = ((local_88 + dVar4) * dVar3 * 0.5) / dVar9;
              if (1.0 < ABS(dVar9)) {
                *in_RCX = 0x1f5;
                return 0x1f5;
              }
              local_c8 = asin(dVar9);
              dVar4 = cos(local_c8);
              if (ABS(dVar4) < 1e-05) {
                *in_RCX = 0x1f5;
                return 0x1f5;
              }
              dVar4 = cos(local_c8);
              dVar3 = (dVar6 * dVar3 * 0.5) / (local_80 * 2.0 * dVar4);
              if (1.0 < ABS(dVar3)) {
                *in_RCX = 0x1f5;
                return 0x1f5;
              }
              dVar3 = asin(dVar3);
              local_d0 = dVar3 + dVar3 + dVar5;
            }
          }
        }
        else if (*pcVar2 == 'N') {
          if ((in_RDI[2] != 'C') || (in_RDI[3] != 'P')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          dVar8 = -local_88 * dVar9 + dVar8;
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_d0 = atan2(dVar6,dVar8);
          local_d0 = dVar5 + local_d0;
          dVar3 = cos(local_d0 - dVar5);
          if ((dVar3 == 0.0) && (!NAN(dVar3))) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar8 = dVar8 / dVar3;
          if ((1.0 < dVar8) || (dVar8 < -1.0)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar3 = acos(dVar8);
          bVar1 = local_c8 < 0.0;
          local_c8 = dVar3;
          if (bVar1) {
            local_c8 = -dVar3;
          }
        }
        else if (*pcVar2 == 'G') {
          if ((in_RDI[2] != 'L') || (in_RDI[3] != 'S')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          local_c8 = local_c8 + local_88;
          if (1.5707963267948974 < ABS(local_c8)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          dVar3 = cos(local_c8);
          if ((dVar3 * 6.28318530717959) / 2.0 < ABS(dVar6)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          if (1e-05 < dVar3) {
            local_d0 = dVar5 + dVar6 / dVar3;
          }
        }
        else {
          if (*pcVar2 != 'M') {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          if ((in_RDI[2] != 'E') || (in_RDI[3] != 'R')) {
            *in_RCX = 0x1f8;
            return 0x1f8;
          }
          local_d8 = in_XMM7_Qa * dVar3 + in_XMM6_Qa * dVar4;
          if ((local_d8 == 0.0) && (!NAN(local_d8))) {
            local_d8 = 1.0;
          }
          dVar3 = (in_XMM3_Qa / 2.0 + 45.0) * 0.01745329252;
          dVar4 = tan(dVar3);
          dVar4 = log(dVar4);
          dVar3 = tan((local_d8 / 2.0) * 0.01745329252 + dVar3);
          dVar3 = log(dVar3);
          dVar3 = (local_d8 * 0.01745329252) / (dVar3 - dVar4);
          local_128 = cos(in_XMM3_Qa * 0.01745329252);
          if (local_128 <= 0.0) {
            local_128 = 1.0;
          }
          local_d0 = dVar6 / local_128 + dVar5;
          if (6.28318530717959 < ABS(local_d0 - dVar5)) {
            *in_RCX = 0x1f5;
            return 0x1f5;
          }
          local_d8 = 0.0;
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            local_d8 = (local_88 + dVar3 * dVar4) / dVar3;
          }
          dVar3 = exp(local_d8);
          dVar3 = atan(dVar3);
          local_c8 = dVar3 + dVar3 + -1.5707963267948974;
        }
      }
      if (3.141592653589795 < local_d0 - dVar5) {
        local_d0 = local_d0 - 6.28318530717959;
      }
      if (local_d0 - dVar5 < -3.141592653589795) {
        local_d0 = local_d0 + 6.28318530717959;
      }
      if (local_d0 < 0.0) {
        local_d0 = local_d0 + 6.28318530717959;
      }
      *in_RSI = local_d0 / 0.01745329252;
      *in_RDX = local_c8 / 0.01745329252;
      local_4 = *in_RCX;
    }
    else {
      *in_RCX = 0x1f8;
      local_4 = 0x1f8;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffwldp(double xpix, double ypix, double xref, double yref,
      double xrefpix, double yrefpix, double xinc, double yinc, double rot,
      char *type, double *xpos, double *ypos, int *status)

/* This routine is based on the classic AIPS WCS routine. 

   It converts from pixel location to RA,Dec for 9 projective geometries:
   "-CAR", "-SIN", "-TAN", "-ARC", "-NCP", "-GLS", "-MER", "-AIT" and "-STG".
*/

/*-----------------------------------------------------------------------*/
/* routine to determine accurate position for pixel coordinates          */
/* returns 0 if successful otherwise:                                    */
/* 501 = angle too large for projection;                                 */
/* does: -CAR, -SIN, -TAN, -ARC, -NCP, -GLS, -MER, -AIT  -STG projections*/
/* Input:                                                                */
/*   f   xpix    x pixel number  (RA or long without rotation)           */
/*   f   ypiy    y pixel number  (dec or lat without rotation)           */
/*   d   xref    x reference coordinate value (deg)                      */
/*   d   yref    y reference coordinate value (deg)                      */
/*   f   xrefpix x reference pixel                                       */
/*   f   yrefpix y reference pixel                                       */
/*   f   xinc    x coordinate increment (deg)                            */
/*   f   yinc    y coordinate increment (deg)                            */
/*   f   rot     rotation (deg)  (from N through E)                      */
/*   c  *type    projection type code e.g. "-SIN";                       */
/* Output:                                                               */
/*   d   *xpos   x (RA) coordinate (deg)                                 */
/*   d   *ypos   y (dec) coordinate (deg)                                */
/*-----------------------------------------------------------------------*/
 {double cosr, sinr, dx, dy, dz, temp, x, y, z;
  double sins, coss, dect, rat, dt, l, m, mg, da, dd, cos0, sin0;
  double dec0, ra0;
  double geo1, geo2, geo3;
  double deps = 1.0e-5;
  char *cptr;
  
  if (*status > 0)
     return(*status);

/*   Offset from ref pixel  */
  dx = (xpix-xrefpix) * xinc;
  dy = (ypix-yrefpix) * yinc;

/*   Take out rotation  */
  cosr = cos(rot * D2R);
  sinr = sin(rot * D2R);
  if (rot != 0.0) {
     temp = dx * cosr - dy * sinr;
     dy = dy * cosr + dx * sinr;
     dx = temp;
  }

/* convert to radians  */
  ra0 = xref * D2R;
  dec0 = yref * D2R;

  l = dx * D2R;
  m = dy * D2R;
  sins = l*l + m*m;
  cos0 = cos(dec0);
  sin0 = sin(dec0);

  if (*type != '-') {  /* unrecognized projection code */
     return(*status = 504);
  }

    cptr = type + 1;

    if (*cptr == 'C') { /* linear -CAR */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      rat =  ra0 + l;
      dect = dec0 + m;

    } else if (*cptr == 'T') {  /* -TAN */
      if (*(cptr + 1) != 'A' ||  *(cptr + 2) != 'N') {
         return(*status = 504);
      }
      x = cos0*cos(ra0) - l*sin(ra0) - m*cos(ra0)*sin0;
      y = cos0*sin(ra0) + l*cos(ra0) - m*sin(ra0)*sin0;
      z = sin0                       + m*         cos0;
      rat  = atan2( y, x );
      dect = atan ( z / sqrt(x*x+y*y) );

    } else if (*cptr == 'S') {

      if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'N') { /* -SIN */
          if (sins>1.0)
	    return(*status = 501);
          coss = sqrt (1.0 - sins);
          dt = sin0 * coss + cos0 * m;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          rat = cos0 * coss - sin0 * m;
          if ((rat==0.0) && (l==0.0))
	    return(*status = 501);
          rat = atan2 (l, rat) + ra0;

       } else if (*(cptr + 1) == 'T' &&  *(cptr + 2) == 'G') {  /* -STG Sterographic*/
          dz = (4.0 - sins) / (4.0 + sins);
          if (fabs(dz)>1.0)
	    return(*status = 501);
          dect = dz * sin0 + m * cos0 * (1.0+dz) / 2.0;
          if (fabs(dect)>1.0)
	    return(*status = 501);
          dect = asin (dect);
          rat = cos(dect);
          if (fabs(rat)<deps)
	    return(*status = 501);
          rat = l * (1.0+dz) / (2.0 * rat);
          if (fabs(rat)>1.0)
	    return(*status = 501);
          rat = asin (rat);
          mg = 1.0 + sin(dect) * sin0 + cos(dect) * cos0 * cos(rat);
          if (fabs(mg)<deps)
	    return(*status = 501);
          mg = 2.0 * (sin(dect) * cos0 - cos(dect) * sin0 * cos(rat)) / mg;
          if (fabs(mg-m)>deps)
	    rat = TWOPI /2.0 - rat;
          rat = ra0 + rat;
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'A') {

      if (*(cptr + 1) == 'R' &&  *(cptr + 2) == 'C') { /* ARC */
          if (sins>=TWOPI*TWOPI/4.0)
	    return(*status = 501);
          sins = sqrt(sins);
          coss = cos (sins);
          if (sins!=0.0)
	    sins = sin (sins) / sins;
          else
	    sins = 1.0;
          dt = m * cos0 * sins + sin0 * coss;
          if ((dt>1.0) || (dt<-1.0))
	    return(*status = 501);
          dect = asin (dt);
          da = coss - dt * sin0;
          dt = l * sins * cos0;
          if ((da==0.0) && (dt==0.0))
	    return(*status = 501);
          rat = ra0 + atan2 (dt, da);

      } else if (*(cptr + 1) == 'I' &&  *(cptr + 2) == 'T') {  /* -AIT Aitoff */
          dt = yinc*cosr + xinc*sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dy = yref * D2R;
          dx = sin(dy+dt)/sqrt((1.0+cos(dy+dt))/2.0) -
	      sin(dy)/sqrt((1.0+cos(dy))/2.0);
          if (dx==0.0)
	    dx = 1.0;
          geo2 = dt / dx;
          dt = xinc*cosr - yinc* sinr;
          if (dt==0.0)
	    dt = 1.0;
          dt = dt * D2R;
          dx = 2.0 * cos(dy) * sin(dt/2.0);
          if (dx==0.0) dx = 1.0;
          geo1 = dt * sqrt((1.0+cos(dy)*cos(dt/2.0))/2.0) / dx;
          geo3 = geo2 * sin(dy) / sqrt((1.0+cos(dy))/2.0);
          rat = ra0;
          dect = dec0;
          if ((l != 0.0) || (m != 0.0)) {
            dz = 4.0 - l*l/(4.0*geo1*geo1) - ((m+geo3)/geo2)*((m+geo3)/geo2) ;
            if ((dz>4.0) || (dz<2.0)) return(*status = 501);
            dz = 0.5 * sqrt (dz);
            dd = (m+geo3) * dz / geo2;
            if (fabs(dd)>1.0) return(*status = 501);
            dd = asin (dd);
            if (fabs(cos(dd))<deps) return(*status = 501);
            da = l * dz / (2.0 * geo1 * cos(dd));
            if (fabs(da)>1.0) return(*status = 501);
            da = asin (da);
            rat = ra0 + 2.0 * da;
            dect = dd;
          }
        } else  {
          return(*status = 504);
        }
 
    } else if (*cptr == 'N') { /* -NCP North celestial pole*/
      if (*(cptr + 1) != 'C' ||  *(cptr + 2) != 'P') {
         return(*status = 504);
      }
      dect = cos0 - m * sin0;
      if (dect==0.0)
        return(*status = 501);
      rat = ra0 + atan2 (l, dect);
      dt = cos (rat-ra0);
      if (dt==0.0)
        return(*status = 501);
      dect = dect / dt;
      if ((dect>1.0) || (dect<-1.0))
        return(*status = 501);
      dect = acos (dect);
      if (dec0<0.0) dect = -dect;

    } else if (*cptr == 'G') {   /* -GLS global sinusoid */
      if (*(cptr + 1) != 'L' ||  *(cptr + 2) != 'S') {
         return(*status = 504);
      }
      dect = dec0 + m;
      if (fabs(dect)>TWOPI/4.0)
        return(*status = 501);
      coss = cos (dect);
      if (fabs(l)>TWOPI*coss/2.0)
        return(*status = 501);
      rat = ra0;
      if (coss>deps) rat = rat + l / coss;

    } else if (*cptr == 'M') {  /* -MER mercator*/
      if (*(cptr + 1) != 'E' ||  *(cptr + 2) != 'R') {
         return(*status = 504);
      }
      dt = yinc * cosr + xinc * sinr;
      if (dt==0.0) dt = 1.0;
      dy = (yref/2.0 + 45.0) * D2R;
      dx = dy + dt / 2.0 * D2R;
      dy = log (tan (dy));
      dx = log (tan (dx));
      geo2 = dt * D2R / (dx - dy);
      geo3 = geo2 * dy;
      geo1 = cos (yref*D2R);
      if (geo1<=0.0) geo1 = 1.0;
      rat = l / geo1 + ra0;
      if (fabs(rat - ra0) > TWOPI)
        return(*status = 501);
      dt = 0.0;
      if (geo2!=0.0) dt = (m + geo3) / geo2;
      dt = exp (dt);
      dect = 2.0 * atan (dt) - TWOPI / 4.0;

    } else  {
      return(*status = 504);
    }

  /*  correct for RA rollover  */
  if (rat-ra0>TWOPI/2.0) rat = rat - TWOPI;
  if (rat-ra0<-TWOPI/2.0) rat = rat + TWOPI;
  if (rat < 0.0) rat += TWOPI;

  /*  convert to degrees  */
  *xpos  = rat  / D2R;
  *ypos  = dect  / D2R;
  return(*status);
}